

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O2

void ps_parser_skip_PS_token(PS_Parser parser)

{
  byte *pbVar1;
  byte bVar2;
  byte *limit;
  FT_Error FVar3;
  FT_Error FVar4;
  byte *local_28;
  
  local_28 = parser->cursor;
  limit = parser->limit;
  skip_spaces(&local_28,limit);
  FVar4 = 3;
  FVar3 = 0;
  pbVar1 = local_28;
  if (limit <= local_28) goto LAB_001f1490;
  bVar2 = *local_28;
  if (bVar2 == 0x28) {
    FVar3 = skip_literal_string(&local_28,limit);
    pbVar1 = local_28;
    goto LAB_001f1490;
  }
  if (bVar2 == 0x2f) {
    local_28 = local_28 + 1;
LAB_001f1514:
    for (; local_28 < limit; local_28 = local_28 + 1) {
      bVar2 = *local_28;
      if ((((ulong)bVar2 < 0x3f) && ((0x5000832100003601U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) ||
         ((bVar2 - 0x5b < 0x23 && ((0x500000005U >> ((ulong)(bVar2 - 0x5b) & 0x3f) & 1) != 0))))
      break;
    }
  }
  else {
    if (bVar2 == 0x3c) {
      if ((limit <= local_28 + 1) || (local_28[1] != 0x3c)) {
        FVar3 = skip_string(&local_28,limit);
        pbVar1 = local_28;
        goto LAB_001f1490;
      }
    }
    else {
      if (bVar2 != 0x3e) {
        if (bVar2 != 0x5b) {
          if (bVar2 == 0x7b) {
            FVar3 = skip_procedure(&local_28,limit);
            pbVar1 = local_28;
            goto LAB_001f1490;
          }
          if (bVar2 != 0x5d) goto LAB_001f1514;
        }
        local_28 = local_28 + 1;
        goto LAB_001f148a;
      }
      pbVar1 = local_28 + 1;
      FVar3 = FVar4;
      if ((limit <= pbVar1) || (*pbVar1 != 0x3e)) goto LAB_001f1490;
    }
    local_28 = local_28 + 2;
  }
LAB_001f148a:
  FVar3 = 0;
  pbVar1 = local_28;
LAB_001f1490:
  local_28 = pbVar1;
  if ((local_28 < limit) && (local_28 == parser->cursor)) {
    FVar3 = FVar4;
  }
  if (limit < local_28) {
    local_28 = limit;
  }
  parser->error = FVar3;
  parser->cursor = local_28;
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  ps_parser_skip_PS_token( PS_Parser  parser )
  {
    /* Note: PostScript allows any non-delimiting, non-whitespace        */
    /*       character in a name (PS Ref Manual, 3rd ed, p31).           */
    /*       PostScript delimiters are (, ), <, >, [, ], {, }, /, and %. */

    FT_Byte*  cur   = parser->cursor;
    FT_Byte*  limit = parser->limit;
    FT_Error  error = FT_Err_Ok;


    skip_spaces( &cur, limit );             /* this also skips comments */
    if ( cur >= limit )
      goto Exit;

    /* self-delimiting, single-character tokens */
    if ( *cur == '[' || *cur == ']' )
    {
      cur++;
      goto Exit;
    }

    /* skip balanced expressions (procedures and strings) */

    if ( *cur == '{' )                              /* {...} */
    {
      error = skip_procedure( &cur, limit );
      goto Exit;
    }

    if ( *cur == '(' )                              /* (...) */
    {
      error = skip_literal_string( &cur, limit );
      goto Exit;
    }

    if ( *cur == '<' )                              /* <...> */
    {
      if ( cur + 1 < limit && *( cur + 1 ) == '<' ) /* << */
      {
        cur++;
        cur++;
      }
      else
        error = skip_string( &cur, limit );

      goto Exit;
    }

    if ( *cur == '>' )
    {
      cur++;
      if ( cur >= limit || *cur != '>' )             /* >> */
      {
        FT_ERROR(( "ps_parser_skip_PS_token:"
                   " unexpected closing delimiter `>'\n" ));
        error = FT_THROW( Invalid_File_Format );
        goto Exit;
      }
      cur++;
      goto Exit;
    }

    if ( *cur == '/' )
      cur++;

    /* anything else */
    while ( cur < limit )
    {
      /* *cur might be invalid (e.g., ')' or '}'), but this   */
      /* is handled by the test `cur == parser->cursor' below */
      if ( IS_PS_DELIM( *cur ) )
        break;

      cur++;
    }

  Exit:
    if ( cur < limit && cur == parser->cursor )
    {
      FT_ERROR(( "ps_parser_skip_PS_token:"
                 " current token is `%c' which is self-delimiting\n",
                 *cur ));
      FT_ERROR(( "                        "
                 " but invalid at this point\n" ));

      error = FT_THROW( Invalid_File_Format );
    }

    if ( cur > limit )
      cur = limit;

    parser->error  = error;
    parser->cursor = cur;
  }